

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void YUV420ToRGB_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,__m128i *R,__m128i *G,__m128i *B)

{
  undefined8 uVar1;
  undefined4 uVar2;
  short sVar3;
  ushort uVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [15];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [15];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [13];
  undefined1 auVar39 [15];
  undefined1 auVar40 [13];
  undefined1 auVar41 [15];
  undefined1 auVar42 [13];
  undefined1 auVar43 [15];
  undefined1 uVar45;
  undefined1 uVar46;
  char cVar47;
  undefined1 uVar48;
  byte bVar49;
  byte bVar50;
  byte bVar51;
  byte bVar52;
  undefined1 auVar44 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  __m128i V0;
  __m128i U0;
  __m128i Y0;
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  char local_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  char cStack_14;
  char cStack_13;
  char cStack_12;
  char cStack_11;
  undefined1 uStack_10;
  char cStack_f;
  undefined1 uStack_e;
  char cStack_d;
  undefined1 uStack_c;
  char cStack_b;
  undefined1 uStack_a;
  char cStack_9;
  
  uVar1 = *(undefined8 *)y;
  bVar52 = (byte)((ulong)uVar1 >> 0x38);
  bVar51 = (byte)((ulong)uVar1 >> 0x30);
  bVar50 = (byte)((ulong)uVar1 >> 0x28);
  auVar35[10] = 0;
  auVar35._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar35[0xb] = bVar50;
  bVar49 = (byte)((ulong)uVar1 >> 0x20);
  auVar36[9] = bVar49;
  auVar36._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar36._10_2_ = auVar35._10_2_;
  auVar37._9_3_ = auVar36._9_3_;
  auVar37._0_9_ = (unkuint9)0;
  uVar48 = (undefined1)((ulong)uVar1 >> 0x18);
  uVar46 = (undefined1)((ulong)uVar1 >> 0x10);
  auVar21._1_10_ = SUB1610(ZEXT516(CONCAT41(auVar37._8_4_,uVar48)) << 0x38,6);
  auVar21[0] = uVar46;
  auVar21._11_5_ = 0;
  uVar45 = (undefined1)((ulong)uVar1 >> 8);
  auVar20._1_12_ = SUB1612(auVar21 << 0x28,4);
  auVar20[0] = uVar45;
  auVar20._13_3_ = 0;
  auVar54._1_14_ = SUB1614(auVar20 << 0x18,2);
  auVar54[0] = (char)uVar1;
  auVar54[0xf] = 0;
  auVar54 = auVar54 << 8;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar54._0_13_;
  auVar5[0xe] = uVar48;
  auVar8[0xc] = 0;
  auVar8._0_12_ = auVar54._0_12_;
  auVar8._13_2_ = auVar5._13_2_;
  auVar11[0xb] = 0;
  auVar11._0_11_ = auVar54._0_11_;
  auVar11._12_3_ = auVar8._12_3_;
  auVar14[10] = uVar46;
  auVar14._0_10_ = auVar54._0_10_;
  auVar14._11_4_ = auVar11._11_4_;
  auVar17[9] = 0;
  auVar17._0_9_ = auVar54._0_9_;
  auVar17._10_5_ = auVar14._10_5_;
  auVar22[8] = 0;
  auVar22._0_8_ = auVar54._0_8_;
  auVar22._9_6_ = auVar17._9_6_;
  auVar29._7_8_ = 0;
  auVar29._0_7_ = auVar22._8_7_;
  auVar32._1_8_ = SUB158(auVar29 << 0x40,7);
  auVar32[0] = uVar45;
  auVar32._9_6_ = 0;
  auVar39._10_5_ = 0;
  auVar39._0_10_ = SUB1510(auVar32 << 0x30,5);
  auVar38._1_12_ = SUB1512(auVar39 << 0x28,3);
  auVar38[0] = (char)uVar1;
  auVar53._0_4_ = auVar38._0_4_ << 0x10;
  auVar53._8_4_ = auVar22._8_4_;
  auVar53._4_3_ = auVar8._12_3_;
  auVar53[7] = 0;
  auVar53._12_4_ = SUB154(auVar32 << 0x30,5) << 8;
  auVar54 = pshufhw(auVar53,auVar53,0xc4);
  auVar55._0_4_ = auVar54._0_4_;
  auVar55._8_4_ = auVar54._8_4_;
  auVar55._4_4_ = auVar54._12_4_;
  auVar55._12_4_ = auVar54._4_4_;
  auVar55 = auVar55 & _DAT_001a8fa0;
  sVar3 = auVar55._0_2_;
  local_18 = (0 < sVar3) * (sVar3 < 0x100) * auVar55[0] - (0xff < sVar3);
  sVar3 = auVar55._2_2_;
  cStack_17 = (0 < sVar3) * (sVar3 < 0x100) * auVar55[2] - (0xff < sVar3);
  sVar3 = auVar55._4_2_;
  cStack_16 = (0 < sVar3) * (sVar3 < 0x100) * auVar55[4] - (0xff < sVar3);
  sVar3 = auVar55._6_2_;
  cStack_15 = (0 < sVar3) * (sVar3 < 0x100) * auVar55[6] - (0xff < sVar3);
  sVar3 = auVar55._8_2_;
  cStack_14 = (0 < sVar3) * (sVar3 < 0x100) * auVar55[8] - (0xff < sVar3);
  sVar3 = auVar55._10_2_;
  cStack_13 = (0 < sVar3) * (sVar3 < 0x100) * auVar55[10] - (0xff < sVar3);
  sVar3 = auVar55._12_2_;
  cStack_12 = (0 < sVar3) * (sVar3 < 0x100) * auVar55[0xc] - (0xff < sVar3);
  sVar3 = auVar55._14_2_;
  cStack_11 = (0 < sVar3) * (sVar3 < 0x100) * auVar55[0xe] - (0xff < sVar3);
  cStack_f = (bVar49 != 0) * (bVar49 < 0x100) * bVar49 - (0xff < bVar49);
  cStack_d = (bVar50 != 0) * (bVar50 < 0x100) * bVar50 - (0xff < bVar50);
  cStack_b = (bVar51 != 0) * (bVar51 < 0x100) * bVar51 - (0xff < bVar51);
  uStack_a = 0;
  cStack_9 = (bVar52 != 0) * (bVar52 < 0x100) * bVar52 - (0xff < bVar52);
  uStack_10 = 0;
  uStack_e = 0;
  uStack_c = 0;
  uVar2 = *(undefined4 *)u;
  bVar49 = (byte)((uint)uVar2 >> 0x18);
  cVar47 = (char)((uint)uVar2 >> 0x10);
  auVar24._1_10_ = SUB1610(ZEXT116(bVar49) << 0x38,6);
  auVar24[0] = cVar47;
  auVar24._11_5_ = 0;
  uVar45 = (undefined1)((uint)uVar2 >> 8);
  auVar23._1_12_ = SUB1612(auVar24 << 0x28,4);
  auVar23[0] = uVar45;
  auVar23._13_3_ = 0;
  auVar56._1_14_ = SUB1614(auVar23 << 0x18,2);
  auVar56[0] = (char)uVar2;
  auVar56[0xf] = 0;
  auVar56 = auVar56 << 8;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar56._0_13_;
  auVar6[0xe] = bVar49;
  auVar9[0xc] = 0;
  auVar9._0_12_ = auVar56._0_12_;
  auVar9._13_2_ = auVar6._13_2_;
  auVar12[0xb] = 0;
  auVar12._0_11_ = auVar56._0_11_;
  auVar12._12_3_ = auVar9._12_3_;
  auVar15[10] = cVar47;
  auVar15._0_10_ = auVar56._0_10_;
  auVar15._11_4_ = auVar12._11_4_;
  auVar18[9] = 0;
  auVar18._0_9_ = auVar56._0_9_;
  auVar18._10_5_ = auVar15._10_5_;
  auVar25[8] = 0;
  auVar25._0_8_ = auVar56._0_8_;
  auVar25._9_6_ = auVar18._9_6_;
  auVar30._7_8_ = 0;
  auVar30._0_7_ = auVar25._8_7_;
  auVar33._1_8_ = SUB158(auVar30 << 0x40,7);
  auVar33[0] = uVar45;
  auVar33._9_6_ = 0;
  auVar41._10_5_ = 0;
  auVar41._0_10_ = SUB1510(auVar33 << 0x30,5);
  auVar40._1_12_ = SUB1512(auVar41 << 0x28,3);
  auVar40[0] = (char)uVar2;
  auVar57._0_4_ = auVar40._0_4_ << 0x10;
  auVar57._8_4_ = auVar25._8_4_;
  auVar57._4_4_ = auVar57._8_4_;
  auVar57._12_4_ = SUB154(auVar33 << 0x30,5) << 8;
  auVar54 = pshuflw(auVar57,auVar57,100);
  auVar54 = pshufhw(auVar54,auVar54,0xcc);
  sVar3 = auVar54._0_2_;
  local_28 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[0] - (0xff < sVar3);
  sVar3 = auVar54._2_2_;
  cStack_27 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[2] - (0xff < sVar3);
  sVar3 = auVar54._4_2_;
  cStack_26 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[4] - (0xff < sVar3);
  sVar3 = auVar54._6_2_;
  cStack_25 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[6] - (0xff < sVar3);
  sVar3 = auVar54._8_2_;
  cStack_24 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[8] - (0xff < sVar3);
  sVar3 = auVar54._10_2_;
  cStack_23 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[10] - (0xff < sVar3);
  sVar3 = auVar54._12_2_;
  cStack_22 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[0xc] - (0xff < sVar3);
  sVar3 = auVar54._14_2_;
  cStack_21 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[0xe] - (0xff < sVar3);
  cStack_20 = -(0xff < auVar25._8_2_);
  sVar3 = auVar15._10_2_;
  cStack_1f = (0 < sVar3) * (sVar3 < 0x100) * cVar47 - (0xff < sVar3);
  cStack_1e = -(0xff < auVar25._8_2_);
  cStack_1d = (0 < sVar3) * (sVar3 < 0x100) * cVar47 - (0xff < sVar3);
  cStack_1c = -(0xff < auVar9._12_2_);
  uVar4 = (ushort)bVar49;
  cStack_1b = (bVar49 != 0) * (uVar4 < 0x100) * bVar49 - (0xff < uVar4);
  cStack_1a = -(0xff < auVar9._12_2_);
  cStack_19 = (bVar49 != 0) * (uVar4 < 0x100) * bVar49 - (0xff < uVar4);
  uVar2 = *(undefined4 *)v;
  bVar49 = (byte)((uint)uVar2 >> 0x18);
  cVar47 = (char)((uint)uVar2 >> 0x10);
  auVar27._1_10_ = SUB1610(ZEXT116(bVar49) << 0x38,6);
  auVar27[0] = cVar47;
  auVar27._11_5_ = 0;
  uVar45 = (undefined1)((uint)uVar2 >> 8);
  auVar26._1_12_ = SUB1612(auVar27 << 0x28,4);
  auVar26[0] = uVar45;
  auVar26._13_3_ = 0;
  auVar58._1_14_ = SUB1614(auVar26 << 0x18,2);
  auVar58[0] = (char)uVar2;
  auVar58[0xf] = 0;
  auVar58 = auVar58 << 8;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar58._0_13_;
  auVar7[0xe] = bVar49;
  auVar10[0xc] = 0;
  auVar10._0_12_ = auVar58._0_12_;
  auVar10._13_2_ = auVar7._13_2_;
  auVar13[0xb] = 0;
  auVar13._0_11_ = auVar58._0_11_;
  auVar13._12_3_ = auVar10._12_3_;
  auVar16[10] = cVar47;
  auVar16._0_10_ = auVar58._0_10_;
  auVar16._11_4_ = auVar13._11_4_;
  auVar19[9] = 0;
  auVar19._0_9_ = auVar58._0_9_;
  auVar19._10_5_ = auVar16._10_5_;
  auVar28[8] = 0;
  auVar28._0_8_ = auVar58._0_8_;
  auVar28._9_6_ = auVar19._9_6_;
  auVar31._7_8_ = 0;
  auVar31._0_7_ = auVar28._8_7_;
  auVar34._1_8_ = SUB158(auVar31 << 0x40,7);
  auVar34[0] = uVar45;
  auVar34._9_6_ = 0;
  auVar43._10_5_ = 0;
  auVar43._0_10_ = SUB1510(auVar34 << 0x30,5);
  auVar42._1_12_ = SUB1512(auVar43 << 0x28,3);
  auVar42[0] = (char)uVar2;
  auVar44._4_4_ = auVar28._8_4_;
  auVar44._0_4_ = auVar42._0_4_ << 0x10;
  auVar44._8_4_ = auVar28._8_4_;
  auVar44._12_4_ = SUB154(auVar34 << 0x30,5) << 8;
  auVar54 = pshuflw(auVar44,auVar44,100);
  auVar54 = pshufhw(auVar54,auVar54,0xcc);
  sVar3 = auVar54._0_2_;
  local_38 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[0] - (0xff < sVar3);
  sVar3 = auVar54._2_2_;
  cStack_37 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[2] - (0xff < sVar3);
  sVar3 = auVar54._4_2_;
  cStack_36 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[4] - (0xff < sVar3);
  sVar3 = auVar54._6_2_;
  cStack_35 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[6] - (0xff < sVar3);
  sVar3 = auVar54._8_2_;
  cStack_34 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[8] - (0xff < sVar3);
  sVar3 = auVar54._10_2_;
  cStack_33 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[10] - (0xff < sVar3);
  sVar3 = auVar54._12_2_;
  cStack_32 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[0xc] - (0xff < sVar3);
  sVar3 = auVar54._14_2_;
  cStack_31 = (0 < sVar3) * (sVar3 < 0x100) * auVar54[0xe] - (0xff < sVar3);
  cStack_30 = -(0xff < auVar28._8_2_);
  sVar3 = auVar16._10_2_;
  cStack_2f = (0 < sVar3) * (sVar3 < 0x100) * cVar47 - (0xff < sVar3);
  cStack_2e = -(0xff < auVar28._8_2_);
  cStack_2d = (0 < sVar3) * (sVar3 < 0x100) * cVar47 - (0xff < sVar3);
  cStack_2c = -(0xff < auVar10._12_2_);
  uVar4 = (ushort)bVar49;
  cStack_2b = (bVar49 != 0) * (uVar4 < 0x100) * bVar49 - (0xff < uVar4);
  cStack_2a = -(0xff < auVar10._12_2_);
  cStack_29 = (bVar49 != 0) * (uVar4 < 0x100) * bVar49 - (0xff < uVar4);
  ConvertYUV444ToRGB_SSE2((__m128i *)&local_18,(__m128i *)&local_28,(__m128i *)&local_38,R,G,B);
  return;
}

Assistant:

static void YUV420ToRGB_SSE2(const uint8_t* WEBP_RESTRICT const y,
                             const uint8_t* WEBP_RESTRICT const u,
                             const uint8_t* WEBP_RESTRICT const v,
                             __m128i* const R, __m128i* const G,
                             __m128i* const B) {
  const __m128i Y0 = Load_HI_16_SSE2(y), U0 = Load_UV_HI_8_SSE2(u),
                V0 = Load_UV_HI_8_SSE2(v);
  ConvertYUV444ToRGB_SSE2(&Y0, &U0, &V0, R, G, B);
}